

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_spirv_c.cpp
# Opt level: O1

bool __thiscall Remapper::remap_srv(Remapper *this,D3DBinding *binding,VulkanSRVBinding *vk_binding)

{
  dxil_spv_bool dVar1;
  bool bVar2;
  dxil_spv_srv_vulkan_binding c_vk_binding;
  dxil_spv_d3d_binding c_binding;
  dxil_spv_srv_vulkan_binding local_58;
  dxil_spv_d3d_binding local_24;
  
  if (this->srv_remapper == (dxil_spv_srv_remapper_cb)0x0) {
    (vk_binding->buffer_binding).bindless.use_heap = false;
    (vk_binding->buffer_binding).descriptor_set = binding->register_space;
    (vk_binding->buffer_binding).binding = binding->register_index;
    (vk_binding->buffer_binding).descriptor_type = Identity;
    (vk_binding->offset_binding).descriptor_set = 0;
    (vk_binding->offset_binding).binding = 0;
    (vk_binding->offset_binding).root_constant_index = 0;
    (vk_binding->offset_binding).bindless.heap_root_offset = 0;
    *(undefined8 *)&(vk_binding->offset_binding).bindless.use_heap = 0;
    bVar2 = true;
  }
  else {
    local_24.stage = binding->stage;
    local_24.kind = (dxil_spv_resource_kind)binding->kind;
    local_24.resource_index = binding->resource_index;
    local_24.register_space = binding->register_space;
    local_24.register_index = binding->register_index;
    local_24.range_size = binding->range_size;
    local_24.alignment = binding->alignment;
    local_58.offset_binding.root_constant_index = 0;
    local_58.offset_binding.bindless.heap_root_offset = 0;
    local_58.offset_binding.bindless.use_heap = '\0';
    local_58.offset_binding.bindless._5_3_ = 0;
    local_58.offset_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_IDENTITY;
    local_58.buffer_binding.bindless.use_heap = '\0';
    local_58.buffer_binding.bindless._5_3_ = 0;
    local_58.buffer_binding.descriptor_type = DXIL_SPV_VULKAN_DESCRIPTOR_TYPE_IDENTITY;
    local_58.offset_binding.set = 0;
    local_58.offset_binding.binding = 0;
    local_58.buffer_binding.set = 0;
    local_58.buffer_binding.binding = 0;
    local_58.buffer_binding.root_constant_index = 0;
    local_58.buffer_binding.bindless.heap_root_offset = 0;
    dVar1 = (*this->srv_remapper)(this->srv_userdata,&local_24,&local_58);
    bVar2 = dVar1 == '\x01';
    if (bVar2) {
      (vk_binding->buffer_binding).descriptor_set = local_58.buffer_binding.set;
      (vk_binding->buffer_binding).binding = local_58.buffer_binding.binding;
      (vk_binding->buffer_binding).root_constant_index = local_58.buffer_binding.root_constant_index
      ;
      (vk_binding->buffer_binding).bindless.use_heap =
           local_58.buffer_binding.bindless.use_heap != '\0';
      (vk_binding->buffer_binding).bindless.heap_root_offset =
           local_58.buffer_binding.bindless.heap_root_offset;
      (vk_binding->buffer_binding).descriptor_type = local_58.buffer_binding.descriptor_type;
      (vk_binding->offset_binding).descriptor_set = local_58.offset_binding.set;
      (vk_binding->offset_binding).binding = local_58.offset_binding.binding;
      (vk_binding->offset_binding).root_constant_index = local_58.offset_binding.root_constant_index
      ;
      (vk_binding->offset_binding).bindless.use_heap =
           local_58.offset_binding.bindless.use_heap != '\0';
      (vk_binding->offset_binding).bindless.heap_root_offset =
           local_58.offset_binding.bindless.heap_root_offset;
      (vk_binding->offset_binding).descriptor_type = local_58.offset_binding.descriptor_type;
    }
  }
  return bVar2;
}

Assistant:

bool remap_srv(const D3DBinding &binding, VulkanSRVBinding &vk_binding) override
	{
		if (srv_remapper)
		{
			const dxil_spv_d3d_binding c_binding = { static_cast<dxil_spv_shader_stage>(binding.stage),
				                                     static_cast<dxil_spv_resource_kind>(binding.kind),
				                                     binding.resource_index,
				                                     binding.register_space,
				                                     binding.register_index,
				                                     binding.range_size,
				                                     binding.alignment };

			dxil_spv_srv_vulkan_binding c_vk_binding = {};
			if (srv_remapper(srv_userdata, &c_binding, &c_vk_binding) == DXIL_SPV_TRUE)
			{
				copy_buffer_binding(vk_binding.buffer_binding, c_vk_binding.buffer_binding);
				copy_buffer_binding(vk_binding.offset_binding, c_vk_binding.offset_binding);
				return true;
			}
			else
				return false;
		}
		else
		{
			vk_binding.buffer_binding.bindless.use_heap = false;
			vk_binding.buffer_binding.descriptor_set = binding.register_space;
			vk_binding.buffer_binding.binding = binding.register_index;
			vk_binding.buffer_binding.descriptor_type = VulkanDescriptorType::Identity;
			vk_binding.offset_binding = {};
			return true;
		}
	}